

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O3

Statement *
slang::ast::Statement::bindBlock
          (StatementBlockSymbol *block,SyntaxNode *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  SyntaxKind SVar1;
  StatementKind SVar2;
  Compilation *comp;
  SyntaxNode *pSVar3;
  SyntaxNode *pSVar4;
  SyntaxKind *pSVar5;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  StatementBlockSymbol *pSVar6;
  bool bVar7;
  int iVar8;
  InvalidStatement *stmt;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  BlockStatement *stmt_00;
  StatementSyntax *pSVar9;
  bool bVar10;
  BlockStatementSyntax *bss;
  long lVar11;
  SmallVector<const_slang::ast::Statement_*,_5UL> buffer;
  Statement *local_88;
  undefined1 local_80 [64];
  SyntaxNode *local_40;
  StatementBlockSymbol *local_38;
  
  comp = ((context->scope).ptr)->compilation;
  SVar1 = syntax->kind;
  if (SVar1 == SequentialBlockStatement) {
LAB_003c5c8d:
    stmt = (InvalidStatement *)
           BlockStatement::fromSyntax(comp,(BlockStatementSyntax *)syntax,context,stmtCtx,true);
    if ((stmt->super_Statement).kind != Invalid) {
      (stmt->super_Statement).syntax = (StatementSyntax *)syntax;
      ASTContext::setAttributes
                (context,(Statement *)stmt,
                 *(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                   *)(syntax + 3));
      *(StatementBlockSymbol **)&stmt[1].super_Statement = block;
    }
  }
  else {
    if (SVar1 == RsCodeBlock) {
      local_80._0_8_ = local_80 + 0x18;
      local_80._8_8_ = 0;
      local_80._16_8_ = 5;
      bindScopeInitializers(context,(SmallVectorBase<const_slang::ast::Statement_*> *)local_80);
      pSVar3 = syntax[3].previewNode;
      local_40 = syntax;
      local_38 = block;
      if (pSVar3 == (SyntaxNode *)0x0) {
        bVar10 = false;
      }
      else {
        pSVar4 = syntax[3].parent;
        lVar11 = 0;
        bVar10 = false;
        do {
          pSVar5 = *(SyntaxKind **)((long)&pSVar4->kind + lVar11);
          bVar7 = slang::syntax::StatementSyntax::isKind(*pSVar5);
          if (bVar7) {
            iVar8 = bind((int)pSVar5,(sockaddr *)context,(socklen_t)stmtCtx);
            local_88 = (Statement *)CONCAT44(extraout_var,iVar8);
            SmallVectorBase<slang::ast::Statement_const*>::
            emplace_back<slang::ast::Statement_const*>
                      ((SmallVectorBase<slang::ast::Statement_const*> *)local_80,&local_88);
            bVar10 = (bool)(bVar10 | ((Statement *)CONCAT44(extraout_var,iVar8))->kind == Invalid);
          }
          lVar11 = lVar11 + 8;
        } while ((long)pSVar3 << 3 != lVar11);
      }
      stmt_00 = createBlockStatement
                          (comp,(SmallVectorBase<const_slang::ast::Statement_*> *)local_80,local_40,
                           Sequential);
      pSVar6 = local_38;
      if ((Statement *)local_80._0_8_ != (Statement *)(local_80 + 0x18)) {
        operator_delete((void *)local_80._0_8_);
      }
      stmt_00->blockSymbol = pSVar6;
      if (!bVar10) {
        return &stmt_00->super_Statement;
      }
    }
    else {
      if (SVar1 == ParallelBlockStatement) goto LAB_003c5c8d;
      local_80._0_8_ = local_80 + 0x18;
      local_80._8_8_ = 0;
      local_80._16_8_ = 5;
      bindScopeInitializers(context,(SmallVectorBase<const_slang::ast::Statement_*> *)local_80);
      pSVar9 = (StatementSyntax *)syntax;
      if (syntax->kind == PatternCaseItem) {
        pSVar9 = *(StatementSyntax **)(syntax + 3);
      }
      iVar8 = bind((int)pSVar9,(sockaddr *)context,(socklen_t)stmtCtx);
      local_88 = (Statement *)CONCAT44(extraout_var_00,iVar8);
      SmallVectorBase<slang::ast::Statement_const*>::emplace_back<slang::ast::Statement_const*>
                ((SmallVectorBase<slang::ast::Statement_const*> *)local_80,&local_88);
      SVar2 = ((Statement *)CONCAT44(extraout_var_00,iVar8))->kind;
      stmt_00 = createBlockStatement
                          (comp,(SmallVectorBase<const_slang::ast::Statement_*> *)local_80,syntax,
                           Sequential);
      (stmt_00->super_Statement).syntax = pSVar9;
      syntax_00._M_ptr =
           (pSVar9->attributes).
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
      syntax_00._M_extent._M_extent_value =
           (pSVar9->attributes).
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
           _M_extent_value;
      ASTContext::setAttributes(context,&stmt_00->super_Statement,syntax_00);
      if ((Statement *)local_80._0_8_ != (Statement *)(local_80 + 0x18)) {
        operator_delete((void *)local_80._0_8_);
      }
      stmt_00->blockSymbol = block;
      if (SVar2 != Invalid) {
        return &stmt_00->super_Statement;
      }
    }
    local_80._0_8_ = stmt_00;
    stmt = BumpAllocator::emplace<slang::ast::InvalidStatement,slang::ast::Statement_const*&>
                     (&comp->super_BumpAllocator,(Statement **)local_80);
  }
  return &stmt->super_Statement;
}

Assistant:

const Statement& Statement::bindBlock(const StatementBlockSymbol& block, const SyntaxNode& syntax,
                                      const ASTContext& context, StatementContext& stmtCtx) {
    BlockStatement* result;
    bool anyBad = false;
    auto& comp = context.getCompilation();

    if (syntax.kind == SyntaxKind::SequentialBlockStatement ||
        syntax.kind == SyntaxKind::ParallelBlockStatement) {
        auto& bss = syntax.as<BlockStatementSyntax>();
        auto& bs = BlockStatement::fromSyntax(comp, bss, context, stmtCtx,
                                              /* addInitializers */ true);
        if (bs.bad())
            return bs;

        result = &bs.as<BlockStatement>();
        result->syntax = &bss;
        context.setAttributes(*result, bss.attributes);
    }
    else if (syntax.kind == SyntaxKind::RsCodeBlock) {
        SmallVector<const Statement*> buffer;
        bindScopeInitializers(context, buffer);

        for (auto item : syntax.as<RsCodeBlockSyntax>().items) {
            if (StatementSyntax::isKind(item->kind)) {
                auto& stmt = bind(item->as<StatementSyntax>(), context, stmtCtx,
                                  /* inList */ true);
                buffer.push_back(&stmt);
                anyBad |= stmt.bad();
            }
        }

        result = createBlockStatement(comp, buffer, syntax);
    }
    else {
        SmallVector<const Statement*> buffer;
        bindScopeInitializers(context, buffer);

        const StatementSyntax* ss;
        if (syntax.kind == SyntaxKind::PatternCaseItem)
            ss = syntax.as<PatternCaseItemSyntax>().statement;
        else
            ss = &syntax.as<StatementSyntax>();
        auto& stmt = bind(*ss, context, stmtCtx, /* inList */ false,
                          /* labelHandled */ true);
        buffer.push_back(&stmt);
        anyBad |= stmt.bad();

        result = createBlockStatement(comp, buffer, syntax);
        result->syntax = ss;
        context.setAttributes(*result, ss->attributes);
    }

    result->blockSymbol = &block;
    if (anyBad)
        return badStmt(comp, result);

    return *result;
}